

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O2

bool __thiscall
re2::NFA::Search(NFA *this,StringPiece *text,StringPiece *const_context,bool anchored,bool longest,
                StringPiece *submatch,int nsubmatch)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Inst *pIVar5;
  long lVar6;
  long lVar7;
  const_pointer pcVar8;
  Threadq *pTVar9;
  uint uVar10;
  char **__s;
  Thread *t0;
  byte *pbVar11;
  ostream *poVar12;
  IndexValue *pIVar13;
  long lVar14;
  IndexValue *pIVar15;
  byte *p;
  uint uVar16;
  byte *pbVar17;
  Threadq *runq;
  Threadq *nextq;
  StringPiece context;
  LogMessage local_1b0;
  
  if (this->start_ == 0) {
    return false;
  }
  context.data_ = const_context->data_;
  context.size_ = const_context->size_;
  if (context.data_ == (const_pointer)0x0) {
    context.data_ = text->data_;
    context.size_ = text->size_;
  }
  pcVar8 = context.data_;
  p = (byte *)text->data_;
  if (context.data_ <= p) {
    pbVar17 = p + text->size_;
    if (pbVar17 <= context.data_ + context.size_) {
      bVar2 = this->prog_->anchor_start_;
      if (((byte *)context.data_ != p & bVar2) != 0) {
        return false;
      }
      if (this->prog_->anchor_end_ == true) {
        if ((byte *)(context.data_ + context.size_) != pbVar17) {
          return false;
        }
        this->endmatch_ = true;
        longest = true;
      }
      if (-1 < nsubmatch) {
        uVar10 = nsubmatch * 2;
        this->ncapture_ = uVar10;
        this->longest_ = longest;
        if (nsubmatch == 0) {
          this->ncapture_ = 2;
          uVar10 = 2;
        }
        bVar1 = bVar2 | anchored;
        __s = (char **)operator_new__((ulong)uVar10 << 3);
        this->match_ = __s;
        this->matched_ = false;
        this->btext_ = pcVar8;
        this->etext_ = (char *)pbVar17;
        (this->q0_).size_ = 0;
        (this->q1_).size_ = 0;
        memset(__s,0,(ulong)uVar10 << 3);
        pTVar9 = &this->q0_;
        runq = &this->q1_;
        do {
          nextq = runq;
          runq = pTVar9;
          uVar10 = 0xffffffff;
          if (p < this->etext_) {
            uVar10 = (uint)*p;
          }
          uVar10 = Step(this,runq,nextq,uVar10,&context,(char *)p);
          runq->size_ = 0;
          pbVar17 = (byte *)this->etext_;
          if (uVar10 != 0) {
            iVar3 = this->ncapture_;
            goto LAB_001b5c21;
          }
          if (pbVar17 < p) break;
          if ((this->matched_ == false) && ((bVar1 & p != (byte *)text->data_) == 0)) {
            uVar10 = Prog::first_byte(this->prog_);
            if (((bVar1 == 0) &&
                (((-1 < (int)uVar10 && (nextq->size_ == 0)) &&
                 (pbVar17 = (byte *)this->etext_, p < pbVar17)))) &&
               ((uVar10 != *p &&
                (pbVar11 = (byte *)memchr(p,uVar10,(long)pbVar17 - (long)p), p = pbVar17,
                pbVar11 != (byte *)0x0)))) {
              p = pbVar11;
            }
            t0 = AllocThread(this);
            CopyCapture(this,t0->capture,this->match_);
            *t0->capture = (char *)p;
            uVar10 = 0xffffffff;
            if (p < this->etext_) {
              uVar10 = (uint)*p;
            }
            AddToThreadq(this,nextq,this->start_,uVar10,&context,(char *)p,t0);
            Decref(this,t0);
          }
          p = p + 1;
          pTVar9 = nextq;
        } while (nextq->size_ != 0);
        goto LAB_001b5cb3;
      }
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/nfa.cc"
                 ,0x1d7);
      poVar12 = std::operator<<((ostream *)&local_1b0.str_,"Bad args: nsubmatch=");
      std::ostream::operator<<(poVar12,nsubmatch);
      goto LAB_001b5a0e;
    }
  }
  LogMessage::LogMessage
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/nfa.cc"
             ,0x1c8);
  std::operator<<((ostream *)&local_1b0.str_,"context does not contain text");
LAB_001b5a0e:
  LogMessage::~LogMessage(&local_1b0);
  return false;
LAB_001b5c21:
  pIVar5 = ((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
           ((long)&(this->prog_->inst_).ptr_._M_t.
                   super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                   _M_t.
                   super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
           + 8))->_M_head_impl;
  uVar4 = pIVar5[(int)uVar10].out_opcode_;
  uVar16 = uVar4 & 7;
  if (uVar16 == 3) {
    if (pIVar5[(int)uVar10].field_1.cap_ < iVar3) {
      this->match_[pIVar5[(int)uVar10].field_1.cap_] = (char *)pbVar17;
    }
  }
  else if (uVar16 != 6) goto LAB_001b5c59;
  uVar10 = uVar4 >> 4;
  goto LAB_001b5c21;
LAB_001b5c59:
  if (uVar16 == 5) {
    this->match_[1] = (char *)pbVar17;
    this->matched_ = true;
  }
  else {
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/nfa.cc"
               ,0x21c);
    poVar12 = std::operator<<((ostream *)&local_1b0.str_,"Unexpected opcode in short circuit: ");
    std::ostream::operator<<(poVar12,pIVar5[(int)uVar10].out_opcode_ & 7);
    LogMessage::~LogMessage(&local_1b0);
  }
LAB_001b5cb3:
  pIVar13 = (nextq->dense_).ptr_._M_t.
            super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
            ._M_t.
            super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
            .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>.
            _M_head_impl;
  for (pIVar15 = pIVar13; pIVar15 != pIVar13 + nextq->size_; pIVar15 = pIVar15 + 1) {
    Decref(this,pIVar15->value_);
    pIVar13 = (nextq->dense_).ptr_._M_t.
              super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
              ._M_t.
              super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
              .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>.
              _M_head_impl;
  }
  if (this->matched_ != true) {
    return false;
  }
  for (lVar14 = 0; (ulong)(uint)nsubmatch << 4 != lVar14; lVar14 = lVar14 + 0x10) {
    lVar6 = *(long *)((long)this->match_ + lVar14);
    lVar7 = *(long *)((long)this->match_ + lVar14 + 8);
    *(long *)((long)&submatch->data_ + lVar14) = lVar6;
    *(long *)((long)&submatch->size_ + lVar14) = lVar7 - lVar6;
  }
  return true;
}

Assistant:

bool NFA::Search(const StringPiece& text, const StringPiece& const_context,
            bool anchored, bool longest,
            StringPiece* submatch, int nsubmatch) {
  if (start_ == 0)
    return false;

  StringPiece context = const_context;
  if (context.data() == NULL)
    context = text;

  // Sanity check: make sure that text lies within context.
  if (text.begin() < context.begin() || text.end() > context.end()) {
    LOG(DFATAL) << "context does not contain text";
    return false;
  }

  if (prog_->anchor_start() && context.begin() != text.begin())
    return false;
  if (prog_->anchor_end() && context.end() != text.end())
    return false;
  anchored |= prog_->anchor_start();
  if (prog_->anchor_end()) {
    longest = true;
    endmatch_ = true;
  }

  if (nsubmatch < 0) {
    LOG(DFATAL) << "Bad args: nsubmatch=" << nsubmatch;
    return false;
  }

  // Save search parameters.
  ncapture_ = 2*nsubmatch;
  longest_ = longest;

  if (nsubmatch == 0) {
    // We need to maintain match[0], both to distinguish the
    // longest match (if longest is true) and also to tell
    // whether we've seen any matches at all.
    ncapture_ = 2;
  }

  match_ = new const char*[ncapture_];
  matched_ = false;

  // For debugging prints.
  btext_ = context.data();
  // For convenience.
  etext_ = text.data() + text.size();

  if (ExtraDebug)
    fprintf(stderr, "NFA::Search %s (context: %s) anchored=%d longest=%d\n",
            std::string(text).c_str(), std::string(context).c_str(), anchored,
            longest);

  // Set up search.
  Threadq* runq = &q0_;
  Threadq* nextq = &q1_;
  runq->clear();
  nextq->clear();
  memset(&match_[0], 0, ncapture_*sizeof match_[0]);

  // Loop over the text, stepping the machine.
  for (const char* p = text.data();; p++) {
    if (ExtraDebug) {
      int c = 0;
      if (p == btext_)
        c = '^';
      else if (p > etext_)
        c = '$';
      else if (p < etext_)
        c = p[0] & 0xFF;

      fprintf(stderr, "%c:", c);
      for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i) {
        Thread* t = i->value();
        if (t == NULL)
          continue;
        fprintf(stderr, " %d%s", i->index(), FormatCapture(t->capture).c_str());
      }
      fprintf(stderr, "\n");
    }

    // This is a no-op the first time around the loop because runq is empty.
    int id = Step(runq, nextq, p < etext_ ? p[0] & 0xFF : -1, context, p);
    DCHECK_EQ(runq->size(), 0);
    using std::swap;
    swap(nextq, runq);
    nextq->clear();
    if (id != 0) {
      // We're done: full match ahead.
      p = etext_;
      for (;;) {
        Prog::Inst* ip = prog_->inst(id);
        switch (ip->opcode()) {
          default:
            LOG(DFATAL) << "Unexpected opcode in short circuit: " << ip->opcode();
            break;

          case kInstCapture:
            if (ip->cap() < ncapture_)
              match_[ip->cap()] = p;
            id = ip->out();
            continue;

          case kInstNop:
            id = ip->out();
            continue;

          case kInstMatch:
            match_[1] = p;
            matched_ = true;
            break;
        }
        break;
      }
      break;
    }

    if (p > etext_)
      break;

    // Start a new thread if there have not been any matches.
    // (No point in starting a new thread if there have been
    // matches, since it would be to the right of the match
    // we already found.)
    if (!matched_ && (!anchored || p == text.data())) {
      // If there's a required first byte for an unanchored search
      // and we're not in the middle of any possible matches,
      // use memchr to search for the byte quickly.
      int fb = prog_->first_byte();
      if (!anchored && runq->size() == 0 &&
          fb >= 0 && p < etext_ && (p[0] & 0xFF) != fb) {
        p = reinterpret_cast<const char*>(memchr(p, fb, etext_ - p));
        if (p == NULL) {
          p = etext_;
        }
      }

      Thread* t = AllocThread();
      CopyCapture(t->capture, match_);
      t->capture[0] = p;
      AddToThreadq(runq, start_, p < etext_ ? p[0] & 0xFF : -1, context, p,
                   t);
      Decref(t);
    }

    // If all the threads have died, stop early.
    if (runq->size() == 0) {
      if (ExtraDebug)
        fprintf(stderr, "dead\n");
      break;
    }
  }

  for (Threadq::iterator i = runq->begin(); i != runq->end(); ++i)
    Decref(i->value());

  if (matched_) {
    for (int i = 0; i < nsubmatch; i++)
      submatch[i] =
          StringPiece(match_[2 * i],
                      static_cast<size_t>(match_[2 * i + 1] - match_[2 * i]));
    if (ExtraDebug)
      fprintf(stderr, "match (%td,%td)\n",
              match_[0] - btext_, match_[1] - btext_);
    return true;
  }
  return false;
}